

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O1

void __thiscall TicSpecial::~TicSpecial(TicSpecial *this)

{
  long lVar1;
  
  lVar1 = -0x24;
  do {
    if ((void *)this->used[lVar1] != (void *)0x0) {
      M_Free((void *)this->used[lVar1]);
      this->used[lVar1] = 0;
      (&this->streamptr)[lVar1] = (BYTE *)0x0;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  this->okay = false;
  return;
}

Assistant:

~TicSpecial ()
	{
		int i;

		for (i = 0; i < BACKUPTICS; i++)
		{
			if (streams[i])
			{
				M_Free (streams[i]);
				streams[i] = NULL;
				used[i] = 0;
			}
		}
		okay = false;
	}